

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O2

int Ifn_AddClause(sat_solver *pSat,int *pBeg,int *pEnd)

{
  uint uVar1;
  uint *pBeg_00;
  uint *puVar2;
  uint uVar3;
  uint *puVar4;
  int iVar5;
  char *pcVar6;
  uint *puVar7;
  
  if (pEnd <= pBeg) {
    __assert_fail("begin < end",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                  ,0x6ca,"int sat_solver_addclause(sat_solver *, lit *, lit *)");
  }
  puVar7 = (uint *)pBeg;
  if (pSat->fPrintClause != 0) {
    for (; puVar7 < pEnd; puVar7 = puVar7 + 1) {
      pcVar6 = "!";
      if ((*puVar7 & 1) == 0) {
        pcVar6 = "";
      }
      printf("%s%d ",pcVar6,(ulong)(uint)((int)*puVar7 >> 1));
    }
    putchar(10);
  }
  veci_resize(&pSat->temp_clause,0);
  for (; pBeg < pEnd; pBeg = pBeg + 1) {
    veci_push(&pSat->temp_clause,*pBeg);
  }
  pBeg_00 = (uint *)(pSat->temp_clause).ptr;
  puVar7 = pBeg_00 + (pSat->temp_clause).size;
  iVar5 = (int)*pBeg_00 >> 1;
  puVar2 = pBeg_00;
  while (puVar2 = puVar2 + 1, puVar2 < puVar7) {
    uVar3 = *puVar2;
    puVar4 = puVar2;
    if (iVar5 < (int)uVar3 >> 1) {
      iVar5 = (int)uVar3 >> 1;
    }
    for (; (pBeg_00 < puVar4 && ((int)uVar3 < (int)puVar4[-1])); puVar4 = puVar4 + -1) {
      *puVar4 = puVar4[-1];
    }
    *puVar4 = uVar3;
  }
  sat_solver_setnvars(pSat,iVar5 + 1);
  if (((Sto_Man_t *)pSat->pStore != (Sto_Man_t *)0x0) &&
     (iVar5 = Sto_ManAddClause((Sto_Man_t *)pSat->pStore,(lit *)pBeg_00,(lit *)puVar7), iVar5 == 0))
  {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                  ,0x6e8,"int sat_solver_addclause(sat_solver *, lit *, lit *)");
  }
  uVar3 = 0xfffffffe;
  iVar5 = 1;
  puVar2 = pBeg_00;
  puVar4 = pBeg_00;
  while( true ) {
    if (puVar7 <= puVar2) {
      if (puVar4 == pBeg_00) {
        iVar5 = 0;
      }
      else {
        if ((long)puVar4 - (long)pBeg_00 == 4) {
          iVar5 = sat_solver_enqueue(pSat,*pBeg_00,0);
          return iVar5;
        }
        sat_solver_clause_new(pSat,(lit *)pBeg_00,(lit *)puVar4,0);
      }
      return iVar5;
    }
    uVar1 = *puVar2;
    if ((uVar1 ^ uVar3) == 1) {
      return 1;
    }
    if ((uVar1 & 1) == (int)pSat->assigns[(int)uVar1 >> 1]) break;
    if (pSat->assigns[(int)uVar1 >> 1] == '\x03' && uVar1 != uVar3) {
      *puVar4 = uVar1;
      puVar4 = puVar4 + 1;
      uVar3 = uVar1;
    }
    puVar2 = puVar2 + 1;
  }
  return 1;
}

Assistant:

int Ifn_AddClause( sat_solver * pSat, int * pBeg, int * pEnd )
{
    int fVerbose = 0;
    int RetValue = sat_solver_addclause( pSat, pBeg, pEnd );
    if ( fVerbose )
    {
        for ( ; pBeg < pEnd; pBeg++ )
            printf( "%c%d ", Abc_LitIsCompl(*pBeg) ? '-':'+', Abc_Lit2Var(*pBeg) );
        printf( "\n" );
    }
    return RetValue;
}